

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O1

QString * QSslSocket::activeBackend(void)

{
  long lVar1;
  QMutex QVar2;
  Data *pDVar3;
  QString *in_RDI;
  long in_FS_OFFSET;
  Data *local_48;
  char16_t *pcStack_40;
  qsizetype local_38;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((QBasicAtomicPointer<QMutexPrivate>)
      QSslSocketPrivate::backendMutex.super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__base_type)0x0
     ) {
    LOCK();
    QSslSocketPrivate::backendMutex.super_QBasicMutex.d_ptr._q_value._M_b._M_p =
         (QBasicMutex)(QBasicAtomicPointer<QMutexPrivate>)0x1;
    UNLOCK();
  }
  else {
    QBasicMutex::lockInternal();
  }
  if (QSslSocketPrivate::activeBackendName.d.size == 0) {
    QTlsBackend::defaultBackendName();
    pDVar3 = QSslSocketPrivate::activeBackendName.d.d;
    QSslSocketPrivate::activeBackendName.d.d = local_48;
    QSslSocketPrivate::activeBackendName.d.ptr = pcStack_40;
    QSslSocketPrivate::activeBackendName.d.size = local_38;
    if (pDVar3 != (Data *)0x0) {
      LOCK();
      (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar3->super_QArrayData,2,0x10);
      }
    }
  }
  pDVar3 = QSslSocketPrivate::activeBackendName.d.d;
  (in_RDI->d).d = QSslSocketPrivate::activeBackendName.d.d;
  (in_RDI->d).ptr = QSslSocketPrivate::activeBackendName.d.ptr;
  (in_RDI->d).size = QSslSocketPrivate::activeBackendName.d.size;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QVar2.super_QBasicMutex.d_ptr._q_value._M_b._M_p =
       QSslSocketPrivate::backendMutex.super_QBasicMutex.d_ptr._q_value._M_b._M_p;
  LOCK();
  QSslSocketPrivate::backendMutex.super_QBasicMutex.d_ptr._q_value._M_b._M_p =
       (QBasicMutex)(QBasicAtomicPointer<QMutexPrivate>)0x0;
  UNLOCK();
  if ((QBasicAtomicPointer<QMutexPrivate>)QVar2.super_QBasicMutex.d_ptr._q_value._M_b._M_p !=
      (__base_type)0x1) {
    QBasicMutex::unlockInternalFutex(&QSslSocketPrivate::backendMutex);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QString QSslSocket::activeBackend()
{
    const QMutexLocker locker(&QSslSocketPrivate::backendMutex);

    if (!QSslSocketPrivate::activeBackendName.size())
        QSslSocketPrivate::activeBackendName = QTlsBackend::defaultBackendName();

    return QSslSocketPrivate::activeBackendName;
}